

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fe4_scmul(uint64_t *out1,uint64_t *arg1,uint64_t arg2)

{
  fiat_uint1 local_f1;
  uint64_t uStack_f0;
  fiat_uint1 x27;
  uint64_t x26;
  uint64_t x25;
  uint64_t uStack_d8;
  fiat_uint1 x24;
  uint64_t x23;
  uint64_t uStack_c8;
  fiat_uint1 x22;
  uint64_t x21;
  uint64_t uStack_b8;
  fiat_uint1 x20;
  uint64_t x19;
  uint64_t uStack_a8;
  fiat_uint1 x18;
  uint64_t x17;
  uint64_t x16;
  uint64_t x15;
  uint64_t uStack_88;
  fiat_uint1 x14;
  uint64_t x13;
  uint64_t x12;
  uint64_t x11;
  uint64_t uStack_68;
  fiat_uint1 x10;
  uint64_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t uStack_48;
  fiat_uint1 x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t arg2_local;
  uint64_t *arg1_local;
  uint64_t *out1_local;
  
  x1 = arg2;
  arg2_local = (uint64_t)arg1;
  arg1_local = out1;
  fiat_mulx_u64(&x2,&x3,*arg1,arg2);
  fiat_mulx_u64(&x4,&x5,*(uint64_t *)(arg2_local + 8),x1);
  fiat_addcarryx_u64(&stack0xffffffffffffffb8,(fiat_uint1 *)((long)&x7 + 7),'\0',x3,x4);
  fiat_mulx_u64(&x8,&x9,*(uint64_t *)(arg2_local + 0x10),x1);
  fiat_addcarryx_u64(&stack0xffffffffffffff98,(fiat_uint1 *)((long)&x11 + 7),x7._7_1_,x5,x8);
  fiat_mulx_u64(&x12,&x13,*(uint64_t *)(arg2_local + 0x18),x1);
  fiat_addcarryx_u64(&stack0xffffffffffffff78,(fiat_uint1 *)((long)&x15 + 7),x11._7_1_,x9,x12);
  fiat_mulx_u64(&x16,&x17,x13 + x15._7_1_,0x26);
  fiat_addcarryx_u64(&stack0xffffffffffffff58,(fiat_uint1 *)((long)&x19 + 7),'\0',x2,x16);
  fiat_addcarryx_u64(&stack0xffffffffffffff48,(fiat_uint1 *)((long)&x21 + 7),x19._7_1_,uStack_48,0);
  fiat_addcarryx_u64(&stack0xffffffffffffff38,(fiat_uint1 *)((long)&x23 + 7),x21._7_1_,uStack_68,0);
  fiat_addcarryx_u64(&stack0xffffffffffffff28,(fiat_uint1 *)((long)&x25 + 7),x23._7_1_,uStack_88,0);
  fiat_cmovznz_u64(&x26,x25._7_1_,0,0x26);
  fiat_addcarryx_u64(&stack0xffffffffffffff10,&local_f1,'\0',uStack_a8,x26);
  *arg1_local = uStack_f0;
  arg1_local[1] = uStack_b8;
  arg1_local[2] = uStack_c8;
  arg1_local[3] = uStack_d8;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_scmul(uint64_t out1[4], const uint64_t arg1[4], uint64_t arg2) {
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  fiat_uint1 x6;
  uint64_t x7;
  uint64_t x8;
  uint64_t x9;
  fiat_uint1 x10;
  uint64_t x11;
  uint64_t x12;
  uint64_t x13;
  fiat_uint1 x14;
  uint64_t x15;
  uint64_t x16;
  uint64_t x17;
  fiat_uint1 x18;
  uint64_t x19;
  fiat_uint1 x20;
  uint64_t x21;
  fiat_uint1 x22;
  uint64_t x23;
  fiat_uint1 x24;
  uint64_t x25;
  uint64_t x26;
  fiat_uint1 x27;
  fiat_mulx_u64(&x1, &x2, (arg1[0]), arg2);
  fiat_mulx_u64(&x3, &x4, (arg1[1]), arg2);
  fiat_addcarryx_u64(&x5, &x6, 0x0, x2, x3);
  fiat_mulx_u64(&x7, &x8, (arg1[2]), arg2);
  fiat_addcarryx_u64(&x9, &x10, x6, x4, x7);
  fiat_mulx_u64(&x11, &x12, (arg1[3]), arg2);
  fiat_addcarryx_u64(&x13, &x14, x10, x8, x11);
  fiat_mulx_u64(&x15, &x16, (x12 + (uint64_t)x14), UINT8_C(0x26));
  fiat_addcarryx_u64(&x17, &x18, 0x0, x1, x15);
  fiat_addcarryx_u64(&x19, &x20, x18, x5, 0x0);
  fiat_addcarryx_u64(&x21, &x22, x20, x9, 0x0);
  fiat_addcarryx_u64(&x23, &x24, x22, x13, 0x0);
  fiat_cmovznz_u64(&x25, x24, 0x0, UINT8_C(0x26)); // NOTE: clang 14 for Zen 2 uses sbb, and
  fiat_addcarryx_u64(&x26, &x27, 0x0, x17, x25);
  out1[0] = x26;
  out1[1] = x19;
  out1[2] = x21;
  out1[3] = x23;
}